

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

void __thiscall QSQLiteResultPrivate::initColumns(QSQLiteResultPrivate *this,bool emptyResultset)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  QChar *pQVar5;
  long *plVar6;
  QChar QVar7;
  int i;
  int N;
  long in_FS_OFFSET;
  QSqlField fld;
  QMetaType local_d0;
  QString local_c8;
  QString local_a8;
  QString local_88;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)&(this->super_QSqlCachedResultPrivate).field_0x8;
  iVar2 = sqlite3_column_count(this->stmt);
  if (0 < iVar2) {
    QSqlCachedResult::init((int)uVar1);
    N = 0;
    do {
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (QChar *)sqlite3_column_name16(this->stmt,N);
      QString::QString((QString *)&local_68,pQVar5,-1);
      QVar7.ucs = (char16_t)(QSqlField *)&local_68;
      plVar6 = (long *)QString::remove(QVar7,0x22);
      local_88.d.d = (Data *)*plVar6;
      local_88.d.ptr = (char16_t *)plVar6[1];
      local_88.d.size = plVar6[2];
      if ((QArrayData *)local_88.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_88.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_88.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,2,0x10);
        }
      }
      local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (QChar *)sqlite3_column_table_name16(this->stmt,N);
      QString::QString((QString *)&local_68,pQVar5,-1);
      plVar6 = (long *)QString::remove(QVar7,0x22);
      local_a8.d.d = (Data *)*plVar6;
      local_a8.d.ptr = (char16_t *)plVar6[1];
      local_a8.d.size = plVar6[2];
      if ((QArrayData *)local_a8.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_a8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_a8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,2,0x10);
        }
      }
      local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (QChar *)sqlite3_column_decltype16(this->stmt,N);
      QString::QString(&local_c8,pQVar5,-1);
      uVar4 = 0xfffffffe;
      if (!emptyResultset) {
        iVar3 = sqlite3_column_type(this->stmt,N);
        uVar4 = iVar3 - 1;
      }
      if ((undefined1 *)local_c8.d.size == (undefined1 *)0x0) {
        iVar3 = 0;
        if (uVar4 < 4) {
          iVar3 = *(int *)(&DAT_002010c0 + (ulong)uVar4 * 4);
        }
      }
      else {
        iVar3 = qGetColumnType(&local_c8);
      }
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QMetaType::QMetaType(&local_d0,iVar3);
      QSqlField::QSqlField((QSqlField *)&local_68,&local_88,local_d0,&local_a8);
      QSqlRecord::append((QSqlField *)&this->rInf);
      QSqlField::~QSqlField((QSqlField *)&local_68);
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      N = N + 1;
    } while (iVar2 != N);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSQLiteResultPrivate::initColumns(bool emptyResultset)
{
    Q_Q(QSQLiteResult);
    int nCols = sqlite3_column_count(stmt);
    if (nCols <= 0)
        return;

    q->init(nCols);

    for (int i = 0; i < nCols; ++i) {
        QString colName = QString(reinterpret_cast<const QChar *>(
                    sqlite3_column_name16(stmt, i))
                    ).remove(u'"');
        const QString tableName = QString(reinterpret_cast<const QChar *>(
                            sqlite3_column_table_name16(stmt, i))
                            ).remove(u'"');
        // must use typeName for resolving the type to match QSqliteDriver::record
        QString typeName = QString(reinterpret_cast<const QChar *>(
                    sqlite3_column_decltype16(stmt, i)));
        // sqlite3_column_type is documented to have undefined behavior if the result set is empty
        int stp = emptyResultset ? -1 : sqlite3_column_type(stmt, i);

        int fieldType;

        if (!typeName.isEmpty()) {
            fieldType = qGetColumnType(typeName);
        } else {
            // Get the proper type for the field based on stp value
            switch (stp) {
            case SQLITE_INTEGER:
                fieldType = QMetaType::Int;
                break;
            case SQLITE_FLOAT:
                fieldType = QMetaType::Double;
                break;
            case SQLITE_BLOB:
                fieldType = QMetaType::QByteArray;
                break;
            case SQLITE_TEXT:
                fieldType = QMetaType::QString;
                break;
            case SQLITE_NULL:
            default:
                fieldType = QMetaType::UnknownType;
                break;
            }
        }

        QSqlField fld(colName, QMetaType(fieldType), tableName);
        rInf.append(fld);
    }
}